

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

void __thiscall cppurses::Text_display::scroll_up(Text_display *this,size_t n)

{
  size_t sVar1;
  size_t local_18;
  size_t n_local;
  Text_display *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  sVar1 = top_line(this);
  if (sVar1 < n) {
    this->top_line_ = 0;
  }
  else {
    this->top_line_ = this->top_line_ - local_18;
  }
  (*(this->super_Widget)._vptr_Widget[3])();
  sig::
  Signal<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>
  ::operator()((Signal<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>
                *)&this->scrolled_up,&local_18);
  return;
}

Assistant:

void Text_display::scroll_up(std::size_t n) {
    if (n > this->top_line()) {
        top_line_ = 0;
    } else {
        top_line_ -= n;
    }
    this->update();
    scrolled_up(n);
}